

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall AbstractModuleClient::initializeHardwareConnection(AbstractModuleClient *this)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_51;
  string local_50;
  TrodesMsg local_30;
  
  MlmWrap::subscribeStream(&this->super_MlmWrap,"Trodes","HUPD");
  bVar1 = MlmWrap::init_hardware_connection(&this->super_MlmWrap);
  if (bVar1) {
    TrodesMsg::TrodesMsg(&local_30);
    std::__cxx11::string::string((string *)&local_50,"s",&local_51);
    TrodesMsg::addcontents<char_const*>(&local_30,&local_50,"GETSETTINGS");
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_30);
    TrodesMsg::~TrodesMsg(&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AbstractModuleClient::initializeHardwareConnection(){
    subscribeStream(TRODES_NETWORK_ID, hardware_update);
    if(init_hardware_connection()){
        //success, ask for hardware settings.
        TrodesMsg m;
        m.addcontents("s", "GETSETTINGS");
        if(sendHardwareMessage(m)){
            //success with get settings
            return true;
        }
        else{
            return false;
        }
    }
    else{
        return false;
    }
}